

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O3

int CVmObjBigNum::is_frac_zero(char *ext)

{
  ushort uVar1;
  ulong uVar2;
  int iVar3;
  
  uVar1 = 0;
  if (0 < (short)*(ushort *)(ext + 2)) {
    uVar1 = *(ushort *)(ext + 2);
  }
  if (uVar1 < *(ushort *)ext) {
    uVar2 = (ulong)uVar1;
    iVar3 = (uint)uVar1 << 2;
    do {
      if (((byte)ext[(uVar2 >> 1) + 5] >> (~(byte)iVar3 & 4) & 0xf) != 0) {
        return 0;
      }
      uVar2 = uVar2 + 1;
      iVar3 = iVar3 + 4;
    } while (*(ushort *)ext != uVar2);
  }
  return 1;
}

Assistant:

int CVmObjBigNum::is_frac_zero(const char *ext)
{
    size_t idx;
    int exp = get_exp(ext);
    size_t prec = get_prec(ext);

    /* start at the first fractional digit, if represented */
    idx = (exp <= 0 ? 0 : (size_t)exp);

    /* scan the digits for a non-zero digit */
    for ( ; idx < prec ; ++idx)
    {
        /* if this digit is non-zero, the fraction is non-zero */
        if (get_dig(ext, idx) != 0)
            return FALSE;
    }

    /* we didn't find any non-zero fractional digits */
    return TRUE;
}